

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

bool __thiscall
IssuingDistributionPoint::Decode
          (IssuingDistributionPoint *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  DecodeResult DVar4;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  undefined1 auStack_58 [8];
  SequenceHelper sh;
  
  auStack_58 = (undefined1  [8])0x0;
  sh.dataSize = 0;
  sh.prefixSize = 0;
  sh.cbUsed._0_1_ = 0;
  sh.cbCurrent = (size_t)cbUsed;
  DVar4 = SequenceHelper::Init
                    ((SequenceHelper *)auStack_58,pIn,cbIn,
                     &(this->super_ExtensionBase).super_DerBase.cbData);
  sVar2 = sh.dataSize;
  if (DVar4 < Success) {
    bVar7 = 6 >> ((byte)DVar4 & 7);
  }
  else {
    lVar1 = *(long *)sh.cbCurrent;
    sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
    bVar3 = ContextSpecificHolder<DistributionPointName,_(unsigned_char)'\xa0',_(OptionType)0>::
            Decode(&this->distributionPoint,pIn + sVar2 + lVar1,sVar5,&sh.prefixSize);
    sVar2 = sh.dataSize;
    if (bVar3) {
      *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
      sh.prefixSize = 0;
    }
    sVar5 = *(size_t *)sh.cbCurrent;
    bVar7 = 1;
    if ((undefined1  [8])sVar5 != auStack_58) {
      sVar6 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      bVar3 = ContextSpecificHolder<Boolean,_(unsigned_char)'\xa1',_(OptionType)0>::Decode
                        (&this->onlyContainsUserCerts,pIn + sVar2 + sVar5,sVar6,&sh.prefixSize);
      sVar2 = sh.dataSize;
      if (bVar3) {
        *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
        sh.prefixSize = 0;
      }
      sVar5 = *(size_t *)sh.cbCurrent;
      if ((undefined1  [8])sVar5 != auStack_58) {
        sVar6 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
        bVar3 = ContextSpecificHolder<Boolean,_(unsigned_char)'\xa2',_(OptionType)0>::Decode
                          (&this->onlyContainsCACerts,pIn + sVar2 + sVar5,sVar6,&sh.prefixSize);
        sVar2 = sh.dataSize;
        if (bVar3) {
          *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
          sh.prefixSize = 0;
        }
        sVar5 = *(size_t *)sh.cbCurrent;
        if ((undefined1  [8])sVar5 != auStack_58) {
          sVar6 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
          bVar3 = ContextSpecificHolder<BitString,_(unsigned_char)'\xa3',_(OptionType)0>::Decode
                            (&this->onlySomeReasons,pIn + sVar2 + sVar5,sVar6,&sh.prefixSize);
          sVar2 = sh.dataSize;
          if (bVar3) {
            *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
            sh.prefixSize = 0;
          }
          sVar5 = *(size_t *)sh.cbCurrent;
          if ((undefined1  [8])sVar5 != auStack_58) {
            sVar6 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
            bVar3 = ContextSpecificHolder<Boolean,_(unsigned_char)'\xa4',_(OptionType)0>::Decode
                              (&this->indirectCRL,pIn + sVar2 + sVar5,sVar6,&sh.prefixSize);
            sVar2 = sh.dataSize;
            if (bVar3) {
              *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
              sh.prefixSize = 0;
            }
            sVar5 = *(size_t *)sh.cbCurrent;
            if ((undefined1  [8])sVar5 != auStack_58) {
              sVar6 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
              bVar3 = ContextSpecificHolder<Boolean,_(unsigned_char)'\xa5',_(OptionType)0>::Decode
                                (&this->onlyContainsAttributeCerts,pIn + sVar2 + sVar5,sVar6,
                                 &sh.prefixSize);
              if (bVar3) {
                *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
                sh.prefixSize = 0;
              }
            }
          }
        }
      }
    }
  }
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
  sh.prefixSize = 0;
  SequenceHelper::CheckExit((SequenceHelper *)auStack_58);
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.dataSize;
  return (bool)(bVar7 & 1);
}

Assistant:

virtual bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed) override
    {
        SequenceHelper sh(cbUsed);

        switch (sh.Init(pIn, cbIn, this->cbData))
        {
        case DecodeResult::Failed:
            return false;
        case DecodeResult::Null:
        case DecodeResult::EmptySequence:
            return true;
        case DecodeResult::Success:
            break;
        }

        // Everything is optional, but it can't be empty.
        /*
            Conforming CRLs issuers MUST NOT issue CRLs where the DER encoding of
            the issuing distribution point extension is an empty sequence.  That
            is, if onlyContainsUserCerts, onlyContainsCACerts, indirectCRL, and
            onlyContainsAttributeCerts are all FALSE, then either the
            distributionPoint field or the onlySomeReasons field MUST be present.
        */
        if (distributionPoint.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (onlyContainsUserCerts.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (onlyContainsCACerts.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (onlySomeReasons.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (indirectCRL.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        if (sh.IsAllUsed())
            return true;

        if (onlyContainsAttributeCerts.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
            sh.Update();

        return true;
    }